

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getConstraintsLowerBound
          (OptimalControlProblem *this,double time,double infinity,VectorDynSize *lowerBound)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  Index size;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  Index index;
  long lVar14;
  _Rb_tree_header *p_Var15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  ulong in_XMM1_Qb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ostringstream errorMsg;
  bool local_201;
  string local_200;
  long local_1e0;
  undefined8 local_1d8;
  ulong uStack_1d0;
  long local_1c8;
  double local_1c0;
  undefined4 local_1b8;
  uint uStack_1b4;
  undefined4 uStack_1b0;
  uint uStack_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = infinity;
  uStack_1d0 = in_XMM1_Qb;
  local_1c0 = time;
  uVar8 = iDynTree::VectorDynSize::size();
  uVar7 = getConstraintsDimension(this);
  if (uVar8 != uVar7) {
    getConstraintsDimension(this);
    iDynTree::VectorDynSize::resize((ulong)lowerBound);
  }
  local_1c8 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  p_Var13 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  local_201 = (_Rb_tree_header *)p_Var13 == p_Var15;
  if (!local_201) {
    local_1b8 = (undefined4)local_1d8;
    uStack_1b4 = local_1d8._4_4_ | 0x80000000;
    local_1d8 = (double)((ulong)local_1d8 | 0x8000000000000000);
    uStack_1d0 = uStack_1d0 | 0x8000000000000000;
    uStack_1b0 = local_1b8;
    local_1e0 = 0;
    uStack_1ac = uStack_1b4;
    do {
      bVar6 = ConstraintsGroup::getLowerBound
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var13 + 2),local_1c0,
                         (VectorDynSize *)(*(undefined8 **)(p_Var13 + 2) + 2));
      if (!bVar6) {
        uVar9 = iDynTree::VectorDynSize::data();
        uVar10 = iDynTree::VectorDynSize::size();
        auVar5 = _DAT_001819f0;
        auVar4 = _DAT_001819e0;
        uVar8 = uVar10;
        if (((uVar9 & 7) == 0) &&
           (uVar8 = (ulong)((uint)(uVar9 >> 3) & 1), (long)uVar10 <= (long)uVar8)) {
          uVar8 = uVar10;
        }
        if (0 < (long)uVar8) {
          lVar14 = uVar8 - 1;
          auVar19._8_4_ = (int)lVar14;
          auVar19._0_8_ = lVar14;
          auVar19._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar19 = auVar19 ^ _DAT_001819f0;
          uVar16 = 0;
          auVar21 = _DAT_001819e0;
          do {
            auVar22 = auVar21 ^ auVar5;
            if ((bool)(~(auVar19._4_4_ < auVar22._4_4_ ||
                        auVar19._0_4_ < auVar22._0_4_ && auVar22._4_4_ == auVar19._4_4_) & 1)) {
              *(double *)(uVar9 + uVar16 * 8) = local_1d8;
            }
            if (auVar22._12_4_ <= auVar19._12_4_ &&
                (auVar22._8_4_ <= auVar19._8_4_ || auVar22._12_4_ != auVar19._12_4_)) {
              *(double *)(uVar9 + 8 + uVar16 * 8) = local_1d8;
            }
            uVar16 = uVar16 + 2;
            lVar14 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 2;
            auVar21._8_8_ = lVar14 + 2;
          } while ((uVar8 + 1 & 0xfffffffffffffffe) != uVar16);
        }
        lVar18 = uVar10 - uVar8;
        lVar14 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
        uVar16 = uVar8;
        if (1 < lVar18) {
          do {
            puVar1 = (undefined8 *)(uVar9 + uVar16 * 8);
            *puVar1 = CONCAT44(uStack_1b4,local_1b8);
            puVar1[1] = CONCAT44(uStack_1ac,uStack_1b0);
            uVar16 = uVar16 + 2;
          } while ((long)uVar16 < lVar14);
        }
        if (lVar14 < (long)uVar10) {
          lVar11 = (uVar10 - lVar14) + -1;
          auVar22._8_4_ = (int)lVar11;
          auVar22._0_8_ = lVar11;
          auVar22._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar18 = (lVar18 / 2) * 0x10 + uVar8 * 8 + uVar9;
          auVar22 = auVar22 ^ auVar5;
          uVar8 = 0;
          do {
            auVar20._8_4_ = (int)uVar8;
            auVar20._0_8_ = uVar8;
            auVar20._12_4_ = (int)(uVar8 >> 0x20);
            auVar21 = (auVar20 | auVar4) ^ auVar5;
            if ((bool)(~(auVar22._4_4_ < auVar21._4_4_ ||
                        auVar22._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar22._4_4_) & 1)) {
              *(double *)(lVar18 + uVar8 * 8) = local_1d8;
            }
            if (auVar21._12_4_ <= auVar22._12_4_ &&
                (auVar21._8_4_ <= auVar22._8_4_ || auVar21._12_4_ != auVar22._12_4_)) {
              *(double *)(lVar18 + 8 + uVar8 * 8) = local_1d8;
            }
            uVar8 = uVar8 + 2;
          } while (((uVar10 - lVar14) + 1 & 0xfffffffffffffffe) != uVar8);
        }
      }
      uVar8 = iDynTree::VectorDynSize::size();
      uVar7 = ConstraintsGroup::constraintsDimension
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var13 + 2));
      if (uVar8 == uVar7) {
        lVar14 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        uVar16 = iDynTree::VectorDynSize::size();
        uVar9 = local_1c8 + local_1e0 * 8;
        uVar10 = uVar16;
        if (((uVar9 & 7) == 0) &&
           (uVar10 = (ulong)((uint)(uVar9 >> 3) & 1), (long)uVar16 <= (long)uVar10)) {
          uVar10 = uVar16;
        }
        if (0 < (long)uVar10) {
          uVar17 = 0;
          do {
            *(undefined8 *)(uVar9 + uVar17 * 8) = *(undefined8 *)(lVar14 + uVar17 * 8);
            uVar17 = uVar17 + 1;
          } while (uVar10 != uVar17);
        }
        lVar18 = uVar16 - uVar10;
        uVar17 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
        if (1 < lVar18) {
          do {
            puVar1 = (undefined8 *)(lVar14 + uVar10 * 8);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)(uVar9 + uVar10 * 8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            uVar10 = uVar10 + 2;
          } while ((long)uVar10 < (long)uVar17);
        }
        if ((long)uVar17 < (long)uVar16) {
          do {
            *(undefined8 *)(uVar9 + uVar17 * 8) = *(undefined8 *)(lVar14 + uVar17 * 8);
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        lVar14 = iDynTree::VectorDynSize::size();
        local_1e0 = local_1e0 + lVar14;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Lower bound dimension different from dimension of group ",
                   0x38);
        ConstraintsGroup::name_abi_cxx11_
                  (&local_200,(ConstraintsGroup *)**(undefined8 **)(p_Var13 + 2));
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                             local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","getConstraintsUpperBound",local_200._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (uVar8 != uVar7) {
        return local_201;
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      local_201 = (_Rb_tree_header *)p_Var13 == p_Var15;
    } while (!local_201);
  }
  return local_201;
}

Assistant:

bool OptimalControlProblem::getConstraintsLowerBound(double time, double infinity, VectorDynSize &lowerBound)
        {
            if (lowerBound.size() != getConstraintsDimension()) {
                lowerBound.resize(getConstraintsDimension());
            }

            Eigen::Map< Eigen::VectorXd > lowerBoundMap = toEigen(lowerBound);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (! group.second->group_ptr->getLowerBound(time, group.second->constraintsBuffer)){
                    toEigen(group.second->constraintsBuffer).setConstant(-std::abs(infinity)); //if not lower bounded
                }

                if (group.second->constraintsBuffer.size() != group.second->group_ptr->constraintsDimension()){
                    std::ostringstream errorMsg;
                    errorMsg << "Lower bound dimension different from dimension of group " << group.second->group_ptr->name() << ".";
                    reportError("OptimalControlProblem", "getConstraintsUpperBound", errorMsg.str().c_str());
                    return false;
                }

                lowerBoundMap.segment(offset, group.second->constraintsBuffer.size()) = toEigen(group.second->constraintsBuffer);
                offset += group.second->constraintsBuffer.size();
            }

            return true;
        }